

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_multisample_interpolation
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  ostream *poVar2;
  string local_3c8;
  ostringstream local_3a8 [8];
  ostringstream source_1;
  int ndx_1;
  string local_208;
  ostringstream local_1e8 [8];
  ostringstream source;
  int ndx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_OES_shader_multisample_interpolation features require enabling the extension in 310 es shaders."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Test sample in/out qualifiers.",(allocator<char> *)&source.field_0x177)
  ;
  NegativeTestContext::beginSection(pNVar1,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)&source.field_0x177);
  for (source._368_4_ = 0; (int)source._368_4_ < 2; source._368_4_ = source._368_4_ + 1) {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    poVar2 = std::operator<<((ostream *)local_1e8,"#version 310 es\n\t");
    poVar2 = std::operator<<(poVar2,shader_multisample_interpolation::s_sampleTests
                                    [(int)source._368_4_]);
    std::operator<<(poVar2,"\nprecision mediump float;\nvoid main()\n{\n}\n");
    pNVar1 = local_10;
    std::__cxx11::ostringstream::str();
    verifyShader(pNVar1,SHADERTYPE_FRAGMENT,&local_208,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_1,"Test interpolateAt* functions.",
             (allocator<char> *)&source_1.field_0x177);
  NegativeTestContext::beginSection(pNVar1,(string *)&ndx_1);
  std::__cxx11::string::~string((string *)&ndx_1);
  std::allocator<char>::~allocator((allocator<char> *)&source_1.field_0x177);
  for (source_1._368_4_ = 0; (int)source_1._368_4_ < 2; source_1._368_4_ = source_1._368_4_ + 1) {
    std::__cxx11::ostringstream::ostringstream(local_3a8);
    poVar2 = std::operator<<((ostream *)local_3a8,
                             "#version 310 es\nin mediump float interpolant;\nprecision mediump float;\nvoid main()\n{\n\t"
                            );
    poVar2 = std::operator<<(poVar2,shader_multisample_interpolation::s_interpolateAtTests
                                    [(int)source_1._368_4_]);
    std::operator<<(poVar2,"\n}\n");
    pNVar1 = local_10;
    std::__cxx11::ostringstream::str();
    verifyShader(pNVar1,SHADERTYPE_FRAGMENT,&local_3c8,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::ostringstream::~ostringstream(local_3a8);
  }
  NegativeTestContext::endSection(local_10);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void shader_multisample_interpolation (NegativeTestContext& ctx)
{
	static const char* const s_sampleTests[] =
	{
		"sample in highp float v_var;",
		"sample out highp float v_var;"
	};

	static const char* const s_interpolateAtTests[] =
	{
		"interpolateAtCentroid(interpolant);",
		"interpolateAtSample(interpolant, 1);",
		"interpolateAtOffset(interpolant, vec2(1.0, 0.0));"
	};

	ctx.beginSection("GL_OES_shader_multisample_interpolation features require enabling the extension in 310 es shaders.");
	ctx.beginSection("Test sample in/out qualifiers.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_sampleTests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"	" << s_sampleTests[ndx] << "\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();

	ctx.beginSection("Test interpolateAt* functions.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_sampleTests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"in mediump float interpolant;\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"	" << s_interpolateAtTests[ndx] << "\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
	ctx.endSection();
}